

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_12ea4::swap8(unsigned_long_long *val)

{
  unsigned_long_long uVar1;
  uchar *src;
  uchar *dst;
  unsigned_long_long tmp;
  unsigned_long_long *val_local;
  
  uVar1 = *val;
  tmp._7_1_ = (undefined1)(uVar1 >> 0x38);
  *(undefined1 *)val = tmp._7_1_;
  tmp._6_1_ = (undefined1)(uVar1 >> 0x30);
  *(undefined1 *)((long)val + 1) = tmp._6_1_;
  tmp._5_1_ = (undefined1)(uVar1 >> 0x28);
  *(undefined1 *)((long)val + 2) = tmp._5_1_;
  tmp._4_1_ = (undefined1)(uVar1 >> 0x20);
  *(undefined1 *)((long)val + 3) = tmp._4_1_;
  tmp._3_1_ = (undefined1)(uVar1 >> 0x18);
  *(undefined1 *)((long)val + 4) = tmp._3_1_;
  tmp._2_1_ = (undefined1)(uVar1 >> 0x10);
  *(undefined1 *)((long)val + 5) = tmp._2_1_;
  tmp._1_1_ = (undefined1)(uVar1 >> 8);
  *(undefined1 *)((long)val + 6) = tmp._1_1_;
  tmp._0_1_ = (undefined1)uVar1;
  *(undefined1 *)((long)val + 7) = (undefined1)tmp;
  return;
}

Assistant:

void swap8(unsigned long long *val) {
  unsigned long long tmp = (*val);
  unsigned char *dst = (unsigned char *)val;
  unsigned char *src = (unsigned char *)&tmp;

  dst[0] = src[7];
  dst[1] = src[6];
  dst[2] = src[5];
  dst[3] = src[4];
  dst[4] = src[3];
  dst[5] = src[2];
  dst[6] = src[1];
  dst[7] = src[0];
}